

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O0

void __thiscall imrt::ACS::printProbability(ACS *this)

{
  int iVar1;
  ostream *poVar2;
  reference this_00;
  double *pdVar3;
  mapped_type *this_01;
  key_type_conflict *in_RDI;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *unaff_retaddr;
  int r;
  int j;
  int a_1;
  int s_1;
  int i;
  int a;
  int s;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  key_type_conflict *__k;
  
  __k = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Intensity probabilities:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_c = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0x3e));
    if (iVar1 <= local_c) break;
    for (local_10 = 0; local_10 < in_RDI[0x40]; local_10 = local_10 + 1) {
      local_14 = 0;
      while( true ) {
        iVar1 = Collimator::getIntensityLevelSize((Collimator *)0x13dde2);
        if (iVar1 <= local_14) break;
        this_00 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                            ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
                             (in_RDI + 0x28),(long)local_c);
        pdVar3 = maths::Matrix::operator()(this_00,local_10,local_14);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar3);
        std::operator<<(poVar2," ");
        local_14 = local_14 + 1;
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    local_c = local_c + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Aperture probabilities:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18 = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0x3e));
    if (iVar1 <= local_18) break;
    for (local_1c = 0; local_1c < in_RDI[0x40]; local_1c = local_1c + 1) {
      local_20 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0x3e));
        if (iVar1 <= local_20) break;
        local_24 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0x3e));
          if (iVar1 <= local_24) break;
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x16),(long)local_18);
          this_01 = std::
                    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                    ::operator[](unaff_retaddr,__k);
          pdVar3 = maths::Matrix::operator()(this_01,local_20,local_24);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar3);
          std::operator<<(poVar2," ");
          local_24 = local_24 + 1;
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        local_20 = local_20 + 1;
      }
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void ACS::printProbability() {
    cout << "Intensity probabilities:"<< endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
          for (int i = 0; i <  collimator.getIntensityLevelSize();i++) {
            cout << iprobability[s](a,i) << " ";
        }
        cout << endl;
      }
    }
    cout << "Aperture probabilities:" << endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            cout << probability[s][a](j,r) <<  " ";
          }
          cout << endl;
        }
      }
    }
  }